

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O0

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,ExpressionList *exp_list,void *data)

{
  bool bVar1;
  size_type sVar2;
  pointer pSVar3;
  int *in_RDX;
  long in_RSI;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *in_RDI;
  int count;
  ExpVarData exp_var_data;
  ExpVarData exp_var_data_1;
  size_t i;
  size_t size;
  int local_58;
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  *in_stack_ffffffffffffffc0;
  bool local_38;
  ExpVarData local_34;
  ulong local_28;
  ulong local_20;
  int *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  bVar1 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!exp_list->exp_list_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                  ,0x2d2,
                  "virtual void luna::SemanticAnalysisVisitor::Visit(ExpressionList *, void *)");
  }
  sVar2 = std::
          vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
          ::size((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                  *)(local_10 + 8));
  local_20 = sVar2 - 1;
  for (local_28 = 0; local_28 < local_20; local_28 = local_28 + 1) {
    ExpVarData::ExpVarData(&local_34,SemanticOp_Read);
    std::
    vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
    ::operator[]((vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
                  *)(local_10 + 8),local_28);
    pSVar3 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                       ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                        0x1e613a);
    (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,in_RDI,&local_34);
  }
  ExpVarData::ExpVarData((ExpVarData *)&stack0xffffffffffffffc0,SemanticOp_Read);
  std::
  vector<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>,_std::allocator<std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>_>_>
  ::back(in_RDI);
  pSVar3 = std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator->
                     ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                      0x1e6182);
  (*pSVar3->_vptr_SyntaxTree[2])(pSVar3,in_RDI,&stack0xffffffffffffffc0);
  if ((local_38 & 1U) == 0) {
    local_58 = (int)local_20 + 1;
  }
  else {
    local_58 = -1;
  }
  *local_18 = local_58;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(ExpressionList *exp_list, void *data)
    {
        assert(!exp_list->exp_list_.empty());

        // Expressions in ExpressionList must be read semantic
        std::size_t size = exp_list->exp_list_.size() - 1;
        for (std::size_t i = 0; i < size; ++i)
        {
            ExpVarData exp_var_data{ SemanticOp_Read };
            exp_list->exp_list_[i]->Accept(this, &exp_var_data);
        }

        // If the last expression in list which has any count value results,
        // then this expression list has any count value results also
        ExpVarData exp_var_data{ SemanticOp_Read };
        exp_list->exp_list_.back()->Accept(this, &exp_var_data);
        int count = exp_var_data.results_any_count_ ? EXP_VALUE_COUNT_ANY : size + 1;
        static_cast<ExpListData *>(data)->exp_value_count_ = count;
    }